

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  container_t *c;
  undefined4 in_ESI;
  roaring_array_t *in_RDI;
  container_t *container;
  uint8_t typecode;
  int32_t i;
  uint16_t hb;
  roaring_array_t *in_stack_ffffffffffffffd8;
  uint8_t local_1d;
  int32_t local_1c;
  undefined2 local_16;
  roaring_array_t *local_10;
  _Bool local_1;
  
  local_16 = (undefined2)((uint)in_ESI >> 0x10);
  local_10 = in_RDI;
  local_1c = ra_get_index(in_stack_ffffffffffffffd8,0);
  if (local_1c < 0) {
    local_1 = false;
  }
  else {
    c = ra_get_container_at_index(local_10,(uint16_t)local_1c,&local_1d);
    local_1 = container_contains(c,0,'\0');
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container = ra_get_container_at_index(&r->high_low_container,
                                                       (uint16_t)i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary
    // search
    return container_contains(container, val & 0xFFFF, typecode);
}